

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int mbedtls_pk_write_key_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  int iVar1;
  mbedtls_pk_type_t mVar2;
  int iVar3;
  mbedtls_rsa_context *pmVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  mbedtls_ecp_keypair *ec_00;
  size_t len_00;
  size_t par_len;
  size_t pub_len;
  mbedtls_ecp_keypair *ec;
  mbedtls_rsa_context *rsa;
  size_t len;
  uchar *c;
  size_t sStack_28;
  int ret;
  size_t size_local;
  uchar *buf_local;
  mbedtls_pk_context *key_local;
  
  len = (size_t)(buf + size);
  sStack_28 = size;
  size_local = (size_t)buf;
  buf_local = (uchar *)key;
  mVar2 = mbedtls_pk_get_type(key);
  if (mVar2 == MBEDTLS_PK_RSA) {
    pmVar4 = mbedtls_pk_rsa(*(mbedtls_pk_context *)buf_local);
    c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,&pmVar4->QP);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar5 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,&pmVar4->DQ);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar6 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,&pmVar4->DP);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar7 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,&pmVar4->Q);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar8 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,&pmVar4->P);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar9 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,&pmVar4->D);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar10 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,&pmVar4->E);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar11 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,&pmVar4->N);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar12 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_int((uchar **)&len,(uchar *)size_local,0);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    sVar13 = (long)c._4_4_ + lVar12 + lVar11 + lVar10 + lVar9 + lVar8 + lVar7 + lVar6 + lVar5;
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,sVar13);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    iVar1 = c._4_4_ + (int)sVar13;
    iVar3 = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'0');
    if (iVar3 < 0) {
      return iVar3;
    }
    rsa._0_4_ = iVar3 + iVar1;
  }
  else {
    mVar2 = mbedtls_pk_get_type((mbedtls_pk_context *)buf_local);
    if (mVar2 != MBEDTLS_PK_ECKEY) {
      return -0x3980;
    }
    ec_00 = mbedtls_pk_ec(*(mbedtls_pk_context *)buf_local);
    c._4_4_ = pk_write_ec_pubkey((uchar **)&len,(uchar *)size_local,ec_00);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar5 = (long)c._4_4_;
    if ((long)(len - size_local) < 1) {
      return -0x6c;
    }
    *(undefined1 *)(len - 1) = 0;
    len = len - 1;
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,lVar5 + 1U);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar6 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'\x03');
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    sVar13 = (long)c._4_4_ + lVar6 + lVar5 + 1U;
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,sVar13);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar5 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,0xa1);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar6 = (long)c._4_4_;
    c._4_4_ = pk_write_ec_param((uchar **)&len,(uchar *)size_local,ec_00);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    len_00 = (size_t)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,len_00);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar7 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,0xa0);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar8 = (long)c._4_4_;
    c._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)size_local,&ec_00->d);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    lVar9 = (long)c._4_4_;
    *(undefined1 *)len = 4;
    c._4_4_ = mbedtls_asn1_write_int((uchar **)&len,(uchar *)size_local,1);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    sVar13 = (long)c._4_4_ + lVar9 + lVar8 + lVar7 + len_00 + lVar6 + lVar5 + sVar13;
    c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,sVar13);
    if (c._4_4_ < 0) {
      return c._4_4_;
    }
    iVar1 = c._4_4_ + (int)sVar13;
    iVar3 = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'0');
    if (iVar3 < 0) {
      return iVar3;
    }
    rsa._0_4_ = iVar3 + iVar1;
  }
  return (int)rsa;
}

Assistant:

int mbedtls_pk_write_key_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret;
    unsigned char *c = buf + size;
    size_t len = 0;

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( *key );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->QP ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->DQ ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->DP ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->Q ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->P ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->D ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->E ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &rsa->N ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 0 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ec = mbedtls_pk_ec( *key );
        size_t pub_len = 0, par_len = 0;

        /*
         * RFC 5915, or SEC1 Appendix C.4
         *
         * ECPrivateKey ::= SEQUENCE {
         *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
         *      privateKey     OCTET STRING,
         *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
         *      publicKey  [1] BIT STRING OPTIONAL
         *    }
         */

        /* publicKey */
        MBEDTLS_ASN1_CHK_ADD( pub_len, pk_write_ec_pubkey( &c, buf, ec ) );

        if( c - buf < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        *--c = 0;
        pub_len += 1;

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_len( &c, buf, pub_len ) );
        MBEDTLS_ASN1_CHK_ADD( pub_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) );
        len += pub_len;

        /* parameters */
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, ec ) );

        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_len( &c, buf, par_len ) );
        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_tag( &c, buf,
                            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) );
        len += par_len;

        /* privateKey: write as MPI then fix tag */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &c, buf, &ec->d ) );
        *c = MBEDTLS_ASN1_OCTET_STRING;

        /* version */
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_int( &c, buf, 1 ) );

        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                    MBEDTLS_ASN1_SEQUENCE ) );
    }
    else
#endif /* MBEDTLS_ECP_C */
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

    return( (int) len );
}